

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

DWARFDie __thiscall llvm::DWARFUnit::getSubroutineForAddress(DWARFUnit *this,uint64_t Address)

{
  iterator iVar1;
  long lVar2;
  DWARFUnit *pDVar3;
  DWARFDebugInfoEntry *pDVar4;
  DWARFDie DVar5;
  uint64_t local_20;
  uint64_t Address_local;
  
  local_20 = Address;
  extractDIEsIfNeeded(this,false);
  if ((this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    DVar5 = getUnitDIE(this,true);
    updateAddressDieMap(this,DVar5);
  }
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
          ::upper_bound(&(this->AddrDieMap)._M_t,&local_20);
  if (iVar1._M_node != (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    lVar2 = std::_Rb_tree_decrement(iVar1._M_node);
    if (local_20 < *(ulong *)(lVar2 + 0x28)) {
      pDVar3 = *(DWARFUnit **)(lVar2 + 0x30);
      pDVar4 = *(DWARFDebugInfoEntry **)(lVar2 + 0x38);
      goto LAB_00da0d16;
    }
  }
  pDVar4 = (DWARFDebugInfoEntry *)0x0;
  pDVar3 = (DWARFUnit *)0x0;
LAB_00da0d16:
  DVar5.Die = pDVar4;
  DVar5.U = pDVar3;
  return DVar5;
}

Assistant:

DWARFDie DWARFUnit::getSubroutineForAddress(uint64_t Address) {
  extractDIEsIfNeeded(false);
  if (AddrDieMap.empty())
    updateAddressDieMap(getUnitDIE());
  auto R = AddrDieMap.upper_bound(Address);
  if (R == AddrDieMap.begin())
    return DWARFDie();
  // upper_bound's previous item contains Address.
  --R;
  if (Address >= R->second.first)
    return DWARFDie();
  return R->second.second;
}